

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_BoundingBox::FarPoint
          (ON_3dPoint *__return_storage_ptr__,ON_BoundingBox *this,ON_3dPoint *test_point)

{
  double local_48;
  double local_40;
  double local_38;
  ON_3dPoint *test_point_local;
  ON_BoundingBox *this_local;
  
  __return_storage_ptr__->x = test_point->x;
  __return_storage_ptr__->y = test_point->y;
  __return_storage_ptr__->z = test_point->z;
  if (ABS((this->m_min).x - test_point->x) < ABS((this->m_max).x - test_point->x)) {
    local_38 = (this->m_max).x;
  }
  else {
    local_38 = (this->m_min).x;
  }
  __return_storage_ptr__->x = local_38;
  if (ABS((this->m_min).y - test_point->y) < ABS((this->m_max).y - test_point->y)) {
    local_40 = (this->m_max).y;
  }
  else {
    local_40 = (this->m_min).y;
  }
  __return_storage_ptr__->y = local_40;
  if (ABS((this->m_min).z - test_point->z) < ABS((this->m_max).z - test_point->z)) {
    local_48 = (this->m_max).z;
  }
  else {
    local_48 = (this->m_min).z;
  }
  __return_storage_ptr__->z = local_48;
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_BoundingBox::FarPoint( 
  const ON_3dPoint& test_point
  ) const
{
  ON_3dPoint far_point = test_point;
 // if ( IsValid() ) {
    far_point.x = ( fabs(m_min.x-test_point.x) >= fabs(m_max.x-test_point.x) )
                ? m_min.x : m_max.x;
    far_point.y = ( fabs(m_min.y-test_point.y) >= fabs(m_max.y-test_point.y) )
                ? m_min.y : m_max.y;
    far_point.z = ( fabs(m_min.z-test_point.z) >= fabs(m_max.z-test_point.z) )
                ? m_min.z : m_max.z;
//  }
  return far_point;
}